

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult
          (BasicResult<Catch::clara::detail::ParseState> *this,Type type,string *message)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00193848;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,pcVar1 + message->_M_string_length);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/3rdparty/Catch2/catch.hpp"
                ,0x2340,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(ResultBase::Type, const std::string &) [T = Catch::clara::detail::ParseState]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }